

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O0

void hmm_init(hmm_context_t *ctx,hmm_t *hmm,int mpx,int ssid,int tmatid)

{
  int local_28;
  int i;
  int tmatid_local;
  int ssid_local;
  int mpx_local;
  hmm_t *hmm_local;
  hmm_context_t *ctx_local;
  
  hmm->ctx = ctx;
  hmm->mpx = (uint8)mpx;
  hmm->n_emit_state = (uint8)ctx->n_emit_state;
  if (mpx == 0) {
    hmm->ssid = (uint16)ssid;
    memcpy(hmm->senid,ctx->sseq[ssid],(ulong)hmm->n_emit_state << 1);
  }
  else {
    hmm->ssid = 0xffff;
    hmm->senid[0] = (uint16)ssid;
    for (local_28 = 1; local_28 < (int)(uint)hmm->n_emit_state; local_28 = local_28 + 1) {
      hmm->senid[local_28] = 0xffff;
    }
  }
  hmm->tmatid = (int16)tmatid;
  hmm_clear(hmm);
  return;
}

Assistant:

void
hmm_init(hmm_context_t *ctx, hmm_t *hmm, int mpx, int ssid, int tmatid)
{
    hmm->ctx = ctx;
    hmm->mpx = mpx;
    hmm->n_emit_state = ctx->n_emit_state;
    if (mpx) {
        int i;
        hmm->ssid = BAD_SSID;
        hmm->senid[0] = ssid;
        for (i = 1; i < hmm_n_emit_state(hmm); ++i) {
            hmm->senid[i] = BAD_SSID;
        }
    }
    else {
        hmm->ssid = ssid;
        memcpy(hmm->senid, ctx->sseq[ssid], hmm->n_emit_state * sizeof(*hmm->senid));
    }
    hmm->tmatid = tmatid;
    hmm_clear(hmm);
}